

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UBool loadParentsExceptRoot
                (UResourceDataEntry **t1,char *name,int32_t nameCapacity,UBool usingUSRData,
                char *usrDataPath,UErrorCode *status)

{
  UBool UVar1;
  Resource RVar2;
  int iVar3;
  bool bVar4;
  UErrorCode local_6c;
  UResourceDataEntry *pUStack_68;
  UErrorCode usrStatus;
  UResourceDataEntry *u2;
  UResourceDataEntry *t2;
  UChar *pUStack_50;
  UErrorCode parentStatus;
  UChar *parentLocaleName;
  Resource local_40;
  int32_t parentLocaleLen;
  Resource parentRes;
  UBool hasChopped;
  UErrorCode *status_local;
  char *usrDataPath_local;
  UBool usingUSRData_local;
  char *pcStack_20;
  int32_t nameCapacity_local;
  char *name_local;
  UResourceDataEntry **t1_local;
  
  _parentRes = status;
  status_local = (UErrorCode *)usrDataPath;
  usrDataPath_local._3_1_ = usingUSRData;
  usrDataPath_local._4_4_ = nameCapacity;
  pcStack_20 = name;
  name_local = (char *)t1;
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    parentLocaleLen._3_1_ = '\x01';
    while( true ) {
      bVar4 = false;
      if (((parentLocaleLen._3_1_ != '\0') &&
          (bVar4 = false, *(long *)(*(long *)name_local + 0x10) == 0)) &&
         (bVar4 = false, *(char *)(*(long *)name_local + 0x60) == '\0')) {
        RVar2 = res_getResource_63((ResourceData *)(*(long *)name_local + 0x28),"%%ParentIsRoot");
        bVar4 = RVar2 == 0xffffffff;
      }
      if (!bVar4) {
        return '\x01';
      }
      local_40 = res_getResource_63((ResourceData *)(*(long *)name_local + 0x28),"%%Parent");
      if (local_40 != 0xffffffff) {
        parentLocaleName._4_4_ = 0;
        pUStack_50 = res_getString_63((ResourceData *)(*(long *)name_local + 0x28),local_40,
                                      (int32_t *)((long)&parentLocaleName + 4));
        if (((pUStack_50 != (UChar *)0x0) && (0 < parentLocaleName._4_4_)) &&
           (parentLocaleName._4_4_ < usrDataPath_local._4_4_)) {
          u_UCharsToChars_63(pUStack_50,pcStack_20,parentLocaleName._4_4_ + 1);
          iVar3 = strcmp(pcStack_20,"root");
          if (iVar3 == 0) {
            return '\x01';
          }
        }
      }
      t2._4_4_ = U_ZERO_ERROR;
      u2 = init_entry(pcStack_20,*(char **)(*(long *)name_local + 8),(UErrorCode *)((long)&t2 + 4));
      UVar1 = U_FAILURE(t2._4_4_);
      if (UVar1 != '\0') {
        *_parentRes = t2._4_4_;
        return '\0';
      }
      pUStack_68 = (UResourceDataEntry *)0x0;
      local_6c = U_ZERO_ERROR;
      if ((usrDataPath_local._3_1_ != '\0') &&
         (pUStack_68 = init_entry(pcStack_20,(char *)status_local,&local_6c),
         local_6c == U_MEMORY_ALLOCATION_ERROR)) break;
      if (((usrDataPath_local._3_1_ == '\0') || (UVar1 = U_SUCCESS(local_6c), UVar1 == '\0')) ||
         (pUStack_68->fBogus != U_ZERO_ERROR)) {
        *(UResourceDataEntry **)(*(long *)name_local + 0x10) = u2;
        if (usrDataPath_local._3_1_ != '\0') {
          pUStack_68->fCountExisting = 0;
        }
      }
      else {
        *(UResourceDataEntry **)(*(long *)name_local + 0x10) = pUStack_68;
        pUStack_68->fParent = u2;
      }
      *(UResourceDataEntry **)name_local = u2;
      parentLocaleLen._3_1_ = chopLocale(pcStack_20);
    }
    *_parentRes = U_MEMORY_ALLOCATION_ERROR;
  }
  return '\0';
}

Assistant:

static UBool  // returns U_SUCCESS(*status)
loadParentsExceptRoot(UResourceDataEntry *&t1,
                      char name[], int32_t nameCapacity,
                      UBool usingUSRData, char usrDataPath[], UErrorCode *status) {
    if (U_FAILURE(*status)) { return FALSE; }
    UBool hasChopped = TRUE;
    while (hasChopped && t1->fParent == NULL && !t1->fData.noFallback &&
            res_getResource(&t1->fData,"%%ParentIsRoot") == RES_BOGUS) {
        Resource parentRes = res_getResource(&t1->fData, "%%Parent");
        if (parentRes != RES_BOGUS) {  // An explicit parent was found.
            int32_t parentLocaleLen = 0;
            const UChar *parentLocaleName = res_getString(&(t1->fData), parentRes, &parentLocaleLen);
            if(parentLocaleName != NULL && 0 < parentLocaleLen && parentLocaleLen < nameCapacity) {
                u_UCharsToChars(parentLocaleName, name, parentLocaleLen + 1);
                if (uprv_strcmp(name, kRootLocaleName) == 0) {
                    return TRUE;
                }
            }
        }
        // Insert regular parents.
        UErrorCode parentStatus = U_ZERO_ERROR;
        UResourceDataEntry *t2 = init_entry(name, t1->fPath, &parentStatus);
        if (U_FAILURE(parentStatus)) {
            *status = parentStatus;
            return FALSE;
        }
        UResourceDataEntry *u2 = NULL;
        UErrorCode usrStatus = U_ZERO_ERROR;
        if (usingUSRData) {  // This code inserts user override data into the inheritance chain.
            u2 = init_entry(name, usrDataPath, &usrStatus);
            // If we failed due to out-of-memory, report that to the caller and exit early.
            if (usrStatus == U_MEMORY_ALLOCATION_ERROR) {
                *status = usrStatus;
                return FALSE;
            }
        }

        if (usingUSRData && U_SUCCESS(usrStatus) && u2->fBogus == U_ZERO_ERROR) {
            t1->fParent = u2;
            u2->fParent = t2;
        } else {
            t1->fParent = t2;
            if (usingUSRData) {
                // The USR override data wasn't found, set it to be deleted.
                u2->fCountExisting = 0;
            }
        }
        t1 = t2;
        hasChopped = chopLocale(name);
    }
    return TRUE;
}